

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-monster.c
# Opt level: O0

_Bool mon_select(monster_race *race)

{
  _Bool _Var1;
  uint32_t uVar2;
  monster_race *race_local;
  
  if ((base_d_char == L'\0') || (base_d_char == race->base->d_char)) {
    if ((select_current_level < L'(') &&
       ((_Var1 = flag_has_dbg(race->flags,0xb,0x3e,"race->flags","RF_UNDEAD"), _Var1 &&
        (_Var1 = flag_has_dbg(race->flags,0xb,0x28,"race->flags","RF_INVISIBLE"), _Var1)))) {
      race_local._7_1_ = false;
    }
    else {
      _Var1 = flag_has_dbg(race->flags,0xb,1,"race->flags","RF_UNIQUE");
      if (_Var1) {
        if ((allow_unique & 1U) == 0) {
          return false;
        }
        uVar2 = Rand_div(5);
        if (uVar2 != 0) {
          return false;
        }
      }
      race_local._7_1_ = true;
    }
  }
  else {
    race_local._7_1_ = false;
  }
  return race_local._7_1_;
}

Assistant:

static bool mon_select(struct monster_race *race)
{
	/* Require that the monster symbol be correct. */
	if (base_d_char != 0 && base_d_char != race->base->d_char) {
		return false;
	}

	/* No invisible undead until deep. */
	if (select_current_level < 40 && rf_has(race->flags, RF_UNDEAD)
			&& rf_has(race->flags, RF_INVISIBLE))
		return (false);

	/* Usually decline unique monsters. */
	if (rf_has(race->flags, RF_UNIQUE)) {
		if (!allow_unique)
			return (false);
		else if (randint0(5) != 0)
			return (false);
	}

	/* Okay */
	return (true);
}